

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::value::color4f>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::value::color4f> *this,color4f *fallback)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  AttrMetas::AttrMetas(&this->_metas);
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&(this->_attrib).contained = 0;
  *(undefined8 *)((long)&(this->_attrib).contained + 8) = 0;
  this->_empty = false;
  fVar1 = fallback->g;
  fVar2 = fallback->b;
  fVar3 = fallback->a;
  (this->_fallback).r = fallback->r;
  (this->_fallback).g = fVar1;
  (this->_fallback).b = fVar2;
  (this->_fallback).a = fVar3;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}